

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

void __thiscall Lexer::mustGetAnyOf(Lexer *this,List<Token> *toks)

{
  ulong uVar1;
  Token TVar2;
  _Elt_pointer pTVar3;
  _Map_pointer ppTVar4;
  _Map_pointer ppTVar5;
  Token *pTVar6;
  bool bVar7;
  _Elt_pointer pTVar8;
  Token *pTVar9;
  TokenInfo *tok;
  ulong uVar10;
  _Map_pointer ppTVar11;
  _Elt_pointer pTVar12;
  Token *pTVar13;
  _Elt_pointer pTVar14;
  Token *pTVar15;
  String toknames;
  bool local_9a;
  bool local_99;
  List<Token> *local_98;
  String local_90;
  String local_70;
  String local_50;
  
  bVar7 = next(this,Any);
  if (!bVar7) {
    error<>("unexpected EOF");
  }
  pTVar14 = (toks->_deque).super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  pTVar3 = (toks->_deque).super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pTVar14 == pTVar3) {
    local_90._string._M_dataplus._M_p = (pointer)&local_90._string.field_2;
    local_90._string._M_string_length = 0;
    local_90._string.field_2._M_local_buf[0] = '\0';
  }
  else {
    pTVar12 = (toks->_deque).super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
              super__Deque_impl_data._M_start._M_last;
    ppTVar11 = (toks->_deque).super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
               super__Deque_impl_data._M_start._M_node;
    pTVar8 = (this->m_tokenPosition)._M_cur;
    local_98 = toks;
    do {
      TVar2 = *pTVar14;
      ppTVar4 = (this->m_tokenPosition)._M_node;
      ppTVar5 = (this->m_tokens)._deque.
                super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      bVar7 = ppTVar4 < ppTVar5;
      if (ppTVar4 == ppTVar5) {
        bVar7 = pTVar8 < (this->m_tokens)._deque.
                         super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>.
                         _M_impl.super__Deque_impl_data._M_finish._M_cur;
      }
      if (bVar7) {
        ppTVar5 = (this->m_tokens)._deque.
                  super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
                  super__Deque_impl_data._M_start._M_node;
        bVar7 = ppTVar5 <= ppTVar4;
        if (ppTVar4 == ppTVar5) {
          bVar7 = (this->m_tokens)._deque.
                  super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur <= pTVar8;
        }
        if (!bVar7) goto LAB_0011e9d4;
      }
      else {
LAB_0011e9d4:
        local_90._string._M_dataplus._M_p = local_90._string._M_dataplus._M_p & 0xffffffffffffff00;
        local_70._string._M_dataplus._M_p._0_1_ = 1;
        error<bool,bool>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/lexer.h:86: hasValidToken() (%1) does not equal true (%2)"
                         ,(bool *)&local_90,(bool *)&local_70);
        pTVar8 = (this->m_tokenPosition)._M_cur;
      }
      if (pTVar8->type == TVar2) {
        return;
      }
      pTVar14 = pTVar14 + 1;
      if (pTVar14 == pTVar12) {
        pTVar14 = ppTVar11[1];
        ppTVar11 = ppTVar11 + 1;
        pTVar12 = pTVar14 + 0x80;
      }
    } while (pTVar14 != pTVar3);
    pTVar13 = (local_98->_deque).super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    pTVar6 = (local_98->_deque).super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    local_90._string._M_dataplus._M_p = (pointer)&local_90._string.field_2;
    local_90._string._M_string_length = 0;
    local_90._string.field_2._M_local_buf[0] = '\0';
    if (pTVar13 != pTVar6) {
      pTVar15 = (local_98->_deque).super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
                super__Deque_impl_data._M_start._M_last;
      ppTVar11 = (local_98->_deque).super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
                 super__Deque_impl_data._M_start._M_node;
      do {
        pTVar14 = (local_98->_deque).super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur;
        uVar10 = (long)pTVar14 -
                 (long)(local_98->_deque).super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_first >> 2;
        uVar1 = uVar10 - 1;
        if ((long)uVar10 < 1) {
          uVar10 = (long)uVar1 >> 7;
LAB_0011ea99:
          pTVar9 = (local_98->_deque).super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_node[uVar10] + uVar1 + uVar10 * -0x80;
        }
        else {
          if (0x80 < uVar10) {
            uVar10 = uVar1 >> 7;
            goto LAB_0011ea99;
          }
          pTVar9 = pTVar14 + -1;
        }
        if ((pTVar13 == pTVar9) || (*local_90._string._M_dataplus._M_p != '\0')) {
          std::__cxx11::string::append((char *)&local_90);
        }
        DescribeTokenPrivate(&local_50,*pTVar13,(TokenInfo *)0x0);
        std::__cxx11::string::append((char *)&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._string._M_dataplus._M_p != &local_50._string.field_2) {
          operator_delete(local_50._string._M_dataplus._M_p);
        }
        pTVar13 = pTVar13 + 1;
        if (pTVar13 == pTVar15) {
          pTVar13 = ppTVar11[1];
          ppTVar11 = ppTVar11 + 1;
          pTVar15 = pTVar13 + 0x80;
        }
      } while (pTVar13 != pTVar6);
    }
  }
  tok = (this->m_tokenPosition)._M_cur;
  ppTVar4 = (this->m_tokenPosition)._M_node;
  ppTVar5 = (this->m_tokens)._deque.
            super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  bVar7 = ppTVar4 < ppTVar5;
  if (ppTVar4 == ppTVar5) {
    bVar7 = tok < (this->m_tokens)._deque.
                  super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur;
  }
  if (bVar7) {
    ppTVar5 = (this->m_tokens)._deque.
              super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
              super__Deque_impl_data._M_start._M_node;
    bVar7 = ppTVar5 <= ppTVar4;
    if (ppTVar4 == ppTVar5) {
      bVar7 = (this->m_tokens)._deque.
              super__Deque_base<Lexer::TokenInfo,_std::allocator<Lexer::TokenInfo>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur <= tok;
    }
    if (bVar7) goto LAB_0011eb9d;
  }
  local_99 = false;
  local_9a = true;
  error<bool,bool>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/lexer.h:86: hasValidToken() (%1) does not equal true (%2)"
                   ,&local_99,&local_9a);
  tok = (this->m_tokenPosition)._M_cur;
LAB_0011eb9d:
  DescribeTokenPrivate(&local_70,tok->type,tok);
  error<String,String>("expected %1, got %2",&local_90,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_70._string._M_dataplus._M_p._1_7_,local_70._string._M_dataplus._M_p._0_1_)
      != &local_70._string.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_70._string._M_dataplus._M_p._1_7_,
                             local_70._string._M_dataplus._M_p._0_1_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._string._M_dataplus._M_p != &local_90._string.field_2) {
    operator_delete(local_90._string._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Lexer::mustGetAnyOf (const List<Token>& toks)
{
	if (!next())
		error ("unexpected EOF");

	for (Token tok : toks)
		if (tokenType() == tok)
			return;

	String toknames;

	for (const Token& tokType : toks)
	{
		if (&tokType == &toks.last())
			toknames += " or ";
		elif (toknames.isEmpty() == false)
			toknames += ", ";

		toknames += DescribeTokenType (tokType);
	}

	error ("expected %1, got %2", toknames, DescribeToken (token()));
}